

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O0

TestDriver * __thiscall xs::ExecutionServer::acquireTestDriver(ExecutionServer *this)

{
  bool bVar1;
  Error *this_00;
  allocator<char> local_31;
  string local_30;
  ExecutionServer *local_10;
  ExecutionServer *this_local;
  
  local_10 = this;
  bVar1 = de::Mutex::tryLock(&this->m_testDriverLock);
  if (!bVar1) {
    this_00 = (Error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Failed to acquire test driver",&local_31);
    Error::Error(this_00,&local_30);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  return &this->m_testDriver;
}

Assistant:

TestDriver* ExecutionServer::acquireTestDriver (void)
{
	if (!m_testDriverLock.tryLock())
		throw Error("Failed to acquire test driver");

	return &m_testDriver;
}